

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::WallyUtil::CreateScriptDataFromBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes,int32_t flags)

{
  uchar *puVar1;
  uchar *bytes_out;
  int iVar2;
  CfdException *this;
  pointer __n;
  size_t written;
  pointer local_50;
  undefined1 local_48 [32];
  
  __n = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish +
        (5 - (long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (size_type)__n,(allocator_type *)local_48);
  local_50 = (pointer)0x0;
  puVar1 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = wally_script_push_from_bytes
                    (puVar1,(long)(bytes->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,flags,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start,(size_t)__n,(size_t *)&local_50);
  if (iVar2 == 0) {
    if (__n < local_50) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                 (size_type)local_50);
      puVar1 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bytes_out = (__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      iVar2 = wally_script_push_from_bytes
                        (puVar1,(long)(bytes->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                         flags,bytes_out,
                         (long)(__return_storage_ptr__->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)bytes_out,
                         (size_t *)&local_50);
      if (iVar2 != 0) goto LAB_003112d6;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (size_type)local_50);
    return __return_storage_ptr__;
  }
LAB_003112d6:
  local_48._0_8_ = "cfdcore_wally_util.cpp";
  local_48._8_4_ = 0x95;
  local_48._16_8_ = "CreateScriptDataFromBytes";
  logger::log<>((CfdSourceLocation *)local_48,kCfdLogLevelWarning,"Script push error.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Script push error.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<uint8_t> WallyUtil::CreateScriptDataFromBytes(
    const std::vector<uint8_t>& bytes, int32_t flags) {
  size_t write_max_size = bytes.size() + kMaxVarIntSize;
  std::vector<uint8_t> ret_bytes(write_max_size);
  size_t written = 0;

  int ret = wally_script_push_from_bytes(
      bytes.data(), bytes.size(), flags, ret_bytes.data(), write_max_size,
      &written);
  if (ret == WALLY_OK && write_max_size < written) {
    // サイズ不足の場合はresizeしてリトライ
    ret_bytes.resize(written);
    ret = wally_script_push_from_bytes(
        bytes.data(), bytes.size(), flags, ret_bytes.data(), ret_bytes.size(),
        &written);
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Script push error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script push error.");
  }
  ret_bytes.resize(written);
  return ret_bytes;
}